

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O2

cTValue * lj_meta_cache(GCtab *mt,MMS mm,GCstr *name)

{
  byte bVar1;
  cTValue *pcVar2;
  
  pcVar2 = lj_tab_getstr(mt,name);
  if ((pcVar2 == (cTValue *)0x0) || (pcVar2->u64 == 0xffffffffffffffff)) {
    bVar1 = (byte)mm & 0x1f;
    mt->nomm = mt->nomm | (byte)(1 << bVar1);
    pcVar2 = (cTValue *)(ulong)(uint)(0 << bVar1);
  }
  return pcVar2;
}

Assistant:

cTValue *lj_meta_cache(GCtab *mt, MMS mm, GCstr *name)
{
  cTValue *mo = lj_tab_getstr(mt, name);
  lj_assertX(mm <= MM_FAST, "bad metamethod %d", mm);
  if (!mo || tvisnil(mo)) {  /* No metamethod? */
    mt->nomm |= (uint8_t)(1u<<mm);  /* Set negative cache flag. */
    return NULL;
  }
  return mo;
}